

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context,sysbvm_tuple_t sourceCode)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t *puVar4;
  size_t sVar5;
  sysbvm_tuple_t outTokenList;
  sysbvm_tokenKind_t sVar6;
  _Bool _Var7;
  ulong uVar8;
  ulong uVar9;
  sysbvm_tokenKind_t kind;
  uint c;
  sysbvm_scanner_tokenConversionFunction_t p_Var10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  sysbvm_scannerState_t local_b8;
  sysbvm_scannerState_t local_98;
  anon_struct_16_2_4aef7a3d gcFrame;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  anon_struct_16_2_4aef7a3d *local_40;
  
  local_40 = &gcFrame;
  gcFrame.tokenList = 0;
  gcFrame.result = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 2;
  sysbvm_stackFrame_pushRecord(&local_58);
  sysbvm_gc_lock(context);
  gcFrame.tokenList = sysbvm_orderedCollection_create(context);
  if ((((sourceCode & 0xf) != 0 || sourceCode == 0) ||
      (uVar13 = *(ulong *)(sourceCode + 0x10), (uVar13 & 0xf) != 0 || uVar13 == 0)) ||
     ((*(uint *)(uVar13 + 8) & 0x300) != 0x200)) {
LAB_0013ab77:
    gcFrame.result = sysbvm_orderedCollection_asArraySlice(context,gcFrame.tokenList);
    sysbvm_gc_unlock(context);
    sysbvm_stackFrame_popRecord(&local_58);
    return gcFrame.result;
  }
  local_b8.text = (uint8_t *)(uVar13 + 0x10);
  local_b8.size = (size_t)*(uint *)(uVar13 + 0xc);
  local_b8.position = 0;
  local_b8.sourceCode = sourceCode;
LAB_00139ea2:
  outTokenList = gcFrame.tokenList;
  sVar5 = local_b8.size;
  puVar4 = local_b8.text;
  kind = SYSBVM_TOKEN_KIND_QUASI_QUOTE;
  uVar13 = local_b8.position;
  if (local_b8.position < local_b8.size) {
LAB_00139ed2:
    do {
      if (local_b8.size <= uVar13) break;
      if (0x20 < local_b8.text[uVar13]) {
        if ((local_b8.text[uVar13] != 0x23) || (local_b8.size <= uVar13 + 1)) goto LAB_00139f9a;
        if (local_b8.text[uVar13 + 1] == '*') {
          local_98.sourceCode = local_b8.sourceCode;
          local_98.text = local_b8.text;
          local_98.size = local_b8.size;
          local_98.position = local_b8.position;
          uVar13 = uVar13 + 2;
          do {
            local_b8.position = uVar13;
            if (local_b8.size <= local_b8.position) {
              sysbvm_scanner_emitTokenForStateRange
                        (context,&local_98,&local_b8,SYSBVM_TOKEN_KIND_ERROR,
                         sysbvm_scanner_incompleteMultilineCommentError,gcFrame.tokenList);
              goto LAB_0013ab77;
            }
            uVar13 = local_b8.position + 1;
          } while (((local_b8.text[local_b8.position] != '*') || (local_b8.size <= uVar13)) ||
                  (local_b8.text[local_b8.position + 1] != '#'));
          uVar13 = local_b8.position + 2;
          local_b8.position = local_b8.position + 2;
        }
        else {
          if (local_b8.text[uVar13 + 1] != '#') goto LAB_00139f9a;
          local_b8.position = uVar13 + 2;
          while (uVar13 = local_b8.size, local_b8.position < local_b8.size) {
            puVar1 = local_b8.text + local_b8.position;
            uVar13 = local_b8.position + 1;
            local_b8.position = uVar13;
            if ((*puVar1 == '\n') || (*puVar1 == '\r')) break;
          }
        }
        goto LAB_00139ed2;
      }
      uVar13 = uVar13 + 1;
      local_b8.position = uVar13;
    } while( true );
  }
  goto LAB_0013ab77;
LAB_00139f9a:
  bVar2 = local_b8.text[uVar13];
  local_98.size = local_b8.size;
  local_98.position = local_b8.position;
  local_98.sourceCode = local_b8.sourceCode;
  local_98.text = local_b8.text;
  uVar11 = 0xffffffff;
  if ((bVar2 == 0x5f) || ((bVar2 & 0xffffffdf) - 0x41 < 0x1a)) {
    do {
      uVar9 = uVar13 + 1;
      uVar12 = uVar11;
      if (uVar9 < sVar5) {
        uVar12 = (uint)puVar4[uVar13 + 1];
      }
      local_b8.position = uVar9;
      _Var7 = sysbvm_scanner_isIdentifierMiddle(uVar12);
      uVar13 = uVar9;
    } while (_Var7);
    while ((uVar9 < sVar5 && (puVar4[uVar9] == ':'))) {
      uVar13 = uVar9 + 1;
      if (sVar5 <= uVar13) goto LAB_0013a1dc;
      if (puVar4[uVar13] != ':') {
LAB_0013a0fd:
        if (puVar4[uVar13] == ':') {
          uVar12 = uVar11;
          if (uVar9 + 2 < sVar5) {
            uVar12 = (uint)puVar4[uVar9 + 2];
          }
          _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
          if (!_Var7) goto LAB_0013a1dc;
          uVar9 = uVar9 + 3;
          do {
            uVar12 = uVar11;
            if (uVar9 < sVar5) {
              uVar12 = (uint)puVar4[uVar9];
            }
            local_b8.position = uVar9;
            _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
            uVar9 = uVar9 + 1;
          } while (_Var7);
          goto LAB_0013a157;
        }
LAB_0013a1dc:
        local_b8.position = uVar13;
        sVar6 = SYSBVM_TOKEN_KIND_KEYWORD;
        do {
          kind = sVar6;
          _Var7 = sysbvm_scanner_advanceKeyword(&local_b8);
          sVar6 = SYSBVM_TOKEN_KIND_MULTI_KEYWORD;
        } while (_Var7);
        goto LAB_0013a21d;
      }
      uVar12 = uVar11;
      if (uVar9 + 2 < sVar5) {
        uVar12 = (uint)puVar4[uVar9 + 2];
      }
      if ((uVar12 != 0x5f) && (0x19 < (uVar12 & 0xffffffdf) - 0x41)) goto LAB_0013a0fd;
      uVar13 = uVar9 + 3;
      do {
        uVar9 = uVar13;
        uVar12 = uVar11;
        if (uVar9 < sVar5) {
          uVar12 = (uint)puVar4[uVar9];
        }
        local_b8.position = uVar9;
        _Var7 = sysbvm_scanner_isIdentifierMiddle(uVar12);
        uVar13 = uVar9 + 1;
      } while (_Var7);
    }
    kind = SYSBVM_TOKEN_KIND_IDENTIFIER;
    goto LAB_0013a21d;
  }
  if (bVar2 - 0x30 < 10) {
LAB_00139fdf:
    kind = SYSBVM_TOKEN_KIND_FLOAT;
    uVar9 = uVar13 + 1;
    uVar13 = uVar13 + 2;
    do {
      uVar8 = uVar13;
      local_b8.position = uVar9;
      uVar12 = uVar11;
      if (local_b8.position < local_b8.size) {
        uVar12 = (uint)local_b8.text[local_b8.position];
      }
      uVar9 = local_b8.position + 1;
      uVar13 = uVar8 + 1;
    } while (uVar12 == 0x5f || uVar12 - 0x30 < 10);
    if (local_b8.position < local_b8.size) {
      uVar3 = local_b8.text[local_b8.position];
      if (uVar3 == '.') {
        if ((uVar9 < local_b8.size) &&
           ((bVar2 = local_b8.text[uVar9], bVar2 - 0x30 < 10 ||
            (((bVar2 == 0x2d || (bVar2 == 0x2b)) &&
             ((local_b8.position + 2 < local_b8.size &&
              (local_b8.text[local_b8.position + 2] - 0x30 < 10)))))))) {
          local_b8.position = local_b8.position + 2;
          uVar13 = uVar9;
          if (((local_b8.position < local_b8.size) &&
              (uVar13 = local_b8.position, local_b8.text[local_b8.position] != '+')) &&
             (local_b8.text[local_b8.position] != '-')) {
            uVar13 = uVar9;
          }
          local_b8.position = uVar13 + 1;
          do {
            uVar9 = local_b8.position;
            uVar12 = uVar11;
            if (uVar9 < local_b8.size) {
              uVar12 = (uint)local_b8.text[uVar9];
            }
            local_b8.position = uVar9 + 1;
          } while (uVar12 == 0x5f || uVar12 - 0x30 < 10);
          p_Var10 = sysbvm_scanner_tokenAsFloat;
          if ((uVar9 < local_b8.size) && ((local_b8.text[uVar9] | 0x20) == 0x65)) {
            if (local_b8.position < local_b8.size) {
              if (local_b8.text[local_b8.position] == '+') goto LAB_0013ab17;
              if (local_b8.text[local_b8.position] == '-') goto LAB_0013ab17;
            }
            while( true ) {
              kind = SYSBVM_TOKEN_KIND_FLOAT;
              uVar12 = uVar11;
              if (local_b8.position < local_b8.size) {
                uVar12 = (uint)local_b8.text[local_b8.position];
              }
              p_Var10 = sysbvm_scanner_tokenAsFloat;
              uVar9 = local_b8.position;
              if (uVar12 != 0x5f && 9 < uVar12 - 0x30) break;
              uVar9 = local_b8.position + 1;
LAB_0013ab17:
              local_b8.position = uVar9;
            }
          }
          goto LAB_0013a229;
        }
      }
      else if ((uVar3 == 'r') || (uVar3 == 'R')) {
        while (((uVar12 = uVar11, uVar8 < local_b8.size &&
                (uVar12 = (uint)local_b8.text[uVar8], local_b8.text[uVar8] - 0x30 < 10)) ||
               ((uVar12 == 0x5f || (local_b8.position = uVar8, (uVar12 & 0xffffffdf) - 0x41 < 0x1a))
               ))) {
          uVar8 = uVar8 + 1;
        }
      }
    }
    kind = SYSBVM_TOKEN_KIND_INTEGER;
    p_Var10 = sysbvm_scanner_tokenAsInteger;
    uVar9 = local_b8.position;
    goto LAB_0013a229;
  }
  switch(bVar2) {
  case 0x22:
    kind = SYSBVM_TOKEN_KIND_ERROR;
    do {
      while( true ) {
        uVar8 = uVar13;
        uVar9 = uVar8 + 1;
        p_Var10 = sysbvm_scanner_incompleteStringError;
        if (local_b8.size <= uVar9) goto LAB_0013a229;
        if (local_b8.text[uVar9] == '\\') break;
        uVar13 = uVar9;
        if (local_b8.text[uVar9] == '\"') {
          kind = SYSBVM_TOKEN_KIND_STRING;
          p_Var10 = sysbvm_scanner_tokenAsString;
          uVar9 = uVar8 + 2;
          goto LAB_0013a229;
        }
      }
      uVar13 = uVar8 + 2;
      uVar9 = uVar13;
    } while (uVar13 < local_b8.size);
    goto LAB_0013a229;
  case 0x23:
    uVar12 = uVar11;
    if (uVar13 + 1 < local_b8.size) {
      uVar12 = (uint)local_b8.text[uVar13 + 1];
    }
    if ((uVar12 == 0x5f) || ((uVar12 & 0xffffffdf) - 0x41 < 0x1a)) {
      uVar13 = uVar13 + 2;
      do {
        uVar9 = uVar13;
        uVar12 = uVar11;
        if (uVar9 < sVar5) {
          uVar12 = (uint)puVar4[uVar9];
        }
        local_b8.position = uVar9;
        _Var7 = sysbvm_scanner_isIdentifierMiddle(uVar12);
        uVar13 = uVar9 + 1;
      } while (_Var7);
      while ((uVar9 < sVar5 && (puVar4[uVar9] == ':'))) {
        uVar13 = uVar9 + 1;
        if ((sVar5 <= uVar13) || (puVar4[uVar13] != ':')) goto LAB_0013a9a4;
        uVar9 = uVar9 + 2;
        uVar12 = uVar11;
        if (uVar9 < sVar5) {
          uVar12 = (uint)puVar4[uVar9];
        }
        if ((uVar12 != 0x5f) && (0x19 < (uVar12 & 0xffffffdf) - 0x41)) {
          uVar12 = uVar11;
          if (uVar9 < sVar5) {
            uVar12 = (uint)puVar4[uVar9];
          }
          _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
          if (!_Var7) goto LAB_0013a9a4;
        }
        uVar12 = uVar11;
        if (uVar9 < sVar5) {
          uVar12 = (uint)puVar4[uVar9];
        }
        local_b8.position = uVar9;
        _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
        if (_Var7) goto LAB_0013a772;
        while( true ) {
          uVar12 = uVar11;
          if (uVar9 < sVar5) {
            uVar12 = (uint)puVar4[uVar9];
          }
          _Var7 = sysbvm_scanner_isIdentifierMiddle(uVar12);
          if (!_Var7) break;
          uVar9 = uVar9 + 1;
          local_b8.position = uVar9;
        }
      }
    }
    else {
      _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
      if (!_Var7) {
        if (uVar12 == 0x7b) {
          local_b8.position = uVar13 + 2;
          kind = SYSBVM_TOKEN_KIND_DICTIONARY_START;
        }
        else if (uVar12 == 0x28) {
          local_b8.position = uVar13 + 2;
          kind = SYSBVM_TOKEN_KIND_LITERAL_ARRAY_START;
        }
        else {
          if (uVar12 != 0x5b) {
            if (uVar12 == 0x22) {
              for (local_b8.position = uVar13 + 2; local_b8.position < sVar5;
                  local_b8.position = local_b8.position + 1) {
                if (puVar4[local_b8.position] == '\\') {
                  local_b8.position = local_b8.position + 1;
                  if (sVar5 <= local_b8.position) break;
                }
                else if (puVar4[local_b8.position] == '\"') {
                  kind = SYSBVM_TOKEN_KIND_SYMBOL;
                  p_Var10 = sysbvm_scanner_tokenAsSymbolString;
                  uVar9 = local_b8.position + 1;
                  goto LAB_0013a229;
                }
              }
              kind = SYSBVM_TOKEN_KIND_ERROR;
              p_Var10 = sysbvm_scanner_incompleteStringError;
              uVar9 = local_b8.position;
              goto LAB_0013a229;
            }
            goto switchD_0013a1b1_caseD_24;
          }
          local_b8.position = uVar13 + 2;
          kind = SYSBVM_TOKEN_KIND_BYTE_ARRAY_START;
        }
        break;
      }
      uVar13 = uVar13 + 2;
      do {
        uVar12 = uVar11;
        if (uVar13 < sVar5) {
          uVar12 = (uint)puVar4[uVar13];
        }
        local_b8.position = uVar13;
        _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
        uVar13 = uVar13 + 1;
      } while (_Var7);
    }
    goto LAB_0013a9b8;
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x2a:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0013a1b1_caseD_24;
  case 0x27:
    kind = SYSBVM_TOKEN_KIND_ERROR;
    do {
      while( true ) {
        uVar8 = uVar13;
        uVar9 = uVar8 + 1;
        p_Var10 = sysbvm_scanner_incompleteCharacterError;
        if (local_b8.size <= uVar9) goto LAB_0013a229;
        if (local_b8.text[uVar9] == '\\') break;
        uVar13 = uVar9;
        if (local_b8.text[uVar9] == '\'') {
          kind = SYSBVM_TOKEN_KIND_CHARACTER;
          p_Var10 = sysbvm_scanner_tokenAsCharacter;
          uVar9 = uVar8 + 2;
          goto LAB_0013a229;
        }
      }
      uVar13 = uVar8 + 2;
      uVar9 = uVar13;
    } while (uVar13 < local_b8.size);
    goto LAB_0013a229;
  case 0x28:
    local_b8.position = uVar13 + 1;
    kind = SYSBVM_TOKEN_KIND_LPARENT;
    break;
  case 0x29:
    local_b8.position = uVar13 + 1;
    kind = SYSBVM_TOKEN_KIND_RPARENT;
    break;
  case 0x2b:
  case 0x2d:
    if ((uVar13 + 1 < local_b8.size) && (local_b8.text[uVar13 + 1] - 0x30 < 10)) goto LAB_00139fdf;
    if (bVar2 == 0x2c) goto LAB_0013a337;
switchD_0013a1b1_caseD_24:
    uVar12 = (uint)bVar2;
    _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
    if (!_Var7) {
LAB_0013a911:
      kind = SYSBVM_TOKEN_KIND_ERROR;
      p_Var10 = sysbvm_scanner_unrecognizedTokenError;
      uVar9 = uVar13 + 1;
      goto LAB_0013a229;
    }
    while( true ) {
      c = uVar11;
      if (uVar13 < sVar5) {
        c = (uint)puVar4[uVar13];
      }
      _Var7 = sysbvm_scanner_isOperatorCharacter(c);
      if (!_Var7) break;
      uVar13 = uVar13 + 1;
      local_b8.position = uVar13;
    }
    if (local_98.position + 1 == uVar13) {
      if (uVar12 == 0x2a) {
        kind = SYSBVM_TOKEN_KIND_STAR;
      }
      else if (uVar12 == 0x3e) {
        kind = SYSBVM_TOKEN_KIND_GREATER_THAN;
      }
      else {
        if (uVar12 != 0x3c) goto LAB_0013a157;
        kind = SYSBVM_TOKEN_KIND_LESS_THAN;
      }
    }
    else {
LAB_0013a157:
      kind = SYSBVM_TOKEN_KIND_OPERATOR;
    }
    break;
  case 0x2c:
LAB_0013a337:
    local_b8.position = uVar13 + 1;
    kind = SYSBVM_TOKEN_KIND_COMMA;
    break;
  case 0x2e:
    local_b8.position = uVar13 + 1;
    if ((((local_b8.position < local_b8.size) && (local_b8.text[local_b8.position] == '.')) &&
        (uVar13 + 2 < local_b8.size)) && (local_b8.text[uVar13 + 2] == '.')) {
      local_b8.position = uVar13 + 3;
      kind = SYSBVM_TOKEN_KIND_ELLIPSIS;
    }
    else {
      kind = SYSBVM_TOKEN_KIND_DOT;
    }
    break;
  case 0x3a:
    uVar9 = uVar13 + 1;
    kind = SYSBVM_TOKEN_KIND_ASSIGNMENT;
    p_Var10 = sysbvm_scanner_tokenAsSymbol;
    if (uVar9 < local_b8.size) {
      if (local_b8.text[uVar9] == '=') {
        uVar9 = uVar13 + 2;
        goto LAB_0013a229;
      }
      if (local_b8.text[uVar9] == ':') {
        kind = SYSBVM_TOKEN_KIND_COLON_COLON;
        uVar9 = uVar13 + 2;
        goto LAB_0013a229;
      }
    }
    kind = SYSBVM_TOKEN_KIND_COLON;
    goto LAB_0013a229;
  case 0x3b:
    local_b8.position = uVar13 + 1;
    kind = SYSBVM_TOKEN_KIND_SEMICOLON;
    break;
  default:
    if (bVar2 == 0x5b) {
      local_b8.position = uVar13 + 1;
      kind = SYSBVM_TOKEN_KIND_LBRACKET;
      break;
    }
    if (bVar2 == 0x5d) {
      local_b8.position = uVar13 + 1;
      kind = SYSBVM_TOKEN_KIND_RBRACKET;
      break;
    }
    if (bVar2 != 0x60) {
      if (bVar2 == 0x7b) {
        local_b8.position = uVar13 + 1;
        kind = SYSBVM_TOKEN_KIND_LCBRACKET;
      }
      else {
        if (bVar2 == 0x7c) {
          uVar13 = uVar13 + 1;
          uVar12 = uVar11;
          if (uVar13 < local_b8.size) {
            uVar12 = (uint)local_b8.text[uVar13];
          }
          local_b8.position = uVar13;
          _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
          p_Var10 = sysbvm_scanner_tokenAsSymbol;
          if (_Var7) {
            while( true ) {
              uVar12 = uVar11;
              if (uVar13 < sVar5) {
                uVar12 = (uint)puVar4[uVar13];
              }
              _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
              if (!_Var7) break;
              uVar13 = uVar13 + 1;
              local_b8.position = uVar13;
            }
            kind = SYSBVM_TOKEN_KIND_OPERATOR;
            uVar9 = local_b8.position;
          }
          else {
            kind = SYSBVM_TOKEN_KIND_BAR;
            uVar9 = local_b8.position;
          }
          goto LAB_0013a229;
        }
        if (bVar2 != 0x7d) goto switchD_0013a1b1_caseD_24;
        local_b8.position = uVar13 + 1;
        kind = SYSBVM_TOKEN_KIND_RCBRACKET;
      }
      break;
    }
    if (uVar13 + 1 < local_b8.size) {
      uVar3 = local_b8.text[uVar13 + 1];
      if (uVar3 == '`') {
        local_b8.position = uVar13 + 2;
      }
      else if (uVar3 == ',') {
        local_b8.position = uVar13 + 2;
        kind = SYSBVM_TOKEN_KIND_QUASI_UNQUOTE;
      }
      else {
        if (uVar3 != '@') {
          if (uVar3 == '\'') {
            kind = SYSBVM_TOKEN_KIND_QUOTE;
            p_Var10 = sysbvm_scanner_tokenAsSymbol;
            uVar9 = uVar13 + 2;
            goto LAB_0013a229;
          }
          goto LAB_0013a911;
        }
        local_b8.position = uVar13 + 2;
        kind = SYSBVM_TOKEN_KIND_SPLICE;
      }
      break;
    }
    goto LAB_0013a911;
  }
LAB_0013a21d:
  p_Var10 = sysbvm_scanner_tokenAsSymbol;
  uVar9 = local_b8.position;
LAB_0013a229:
  local_b8.position = uVar9;
  sysbvm_scanner_emitTokenForStateRange(context,&local_98,&local_b8,kind,p_Var10,outTokenList);
  goto LAB_00139ea2;
LAB_0013a9a4:
  do {
    local_b8.position = uVar13;
    _Var7 = sysbvm_scanner_advanceKeyword(&local_b8);
    uVar13 = local_b8.position;
  } while (_Var7);
  goto LAB_0013a9b8;
LAB_0013a772:
  while( true ) {
    uVar12 = uVar11;
    if (uVar9 < sVar5) {
      uVar12 = (uint)puVar4[uVar9];
    }
    _Var7 = sysbvm_scanner_isOperatorCharacter(uVar12);
    if (!_Var7) break;
    uVar9 = uVar9 + 1;
    local_b8.position = uVar9;
  }
LAB_0013a9b8:
  kind = SYSBVM_TOKEN_KIND_SYMBOL;
  p_Var10 = sysbvm_scanner_tokenAsSymbolWithoutPrefix;
  uVar9 = local_b8.position;
  goto LAB_0013a229;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_scanner_scan(sysbvm_context_t *context, sysbvm_tuple_t sourceCode)
{
    struct {
        sysbvm_tuple_t tokenList;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_gc_lock(context);

    gcFrame.tokenList = sysbvm_orderedCollection_create(context);

    if(sysbvm_tuple_isNonNullPointer(sourceCode))
    {
        sysbvm_sourceCode_t *sourceCodeObject = (sysbvm_sourceCode_t*)sourceCode;
        if(sysbvm_tuple_isBytes(sourceCodeObject->text))
        {
            sysbvm_scannerState_t scannerState = {
                .sourceCode = sourceCode,
                .text = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(sourceCodeObject->text)->bytes,
                .size = sysbvm_tuple_getSizeInBytes(sourceCodeObject->text),
                .position = 0
            };

            while(scannerState.position < scannerState.size)
            {
                if(!sysbvm_scanner_scanNextTokenInto(context, &scannerState, gcFrame.tokenList))
                    break;
            }
        }
    }

    gcFrame.result = sysbvm_orderedCollection_asArraySlice(context, gcFrame.tokenList);
    sysbvm_gc_unlock(context);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}